

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_directory_descriptors(archive_write *a,vdd *vdd)

{
  int iVar1;
  uchar *__dest;
  long *in_RSI;
  archive_write *in_RDI;
  uchar *wb;
  extr_rec *extr;
  int r;
  int depth;
  isoent *np;
  size_t size;
  int iVar2;
  long local_20;
  
  iVar2 = 0;
  local_20 = *in_RSI;
  do {
    iVar1 = _write_directory_descriptors((archive_write *)np,_r,(isoent *)extr,wb._4_4_);
    if (iVar1 < 0) {
      return iVar1;
    }
    if ((int)in_RSI[1] != 1) {
      for (size = *(size_t *)(local_20 + 0xd0); size != 0; size = *(size_t *)(size + 0x808)) {
        __dest = wb_buffptr(in_RDI);
        memcpy(__dest,(void *)(size + 8),(long)*(int *)(size + 4));
        memset(__dest + *(int *)(size + 4),0,(long)(0x800 - *(int *)(size + 4)));
        iVar1 = wb_consume((archive_write *)CONCAT44(iVar2,iVar1),size);
        if (iVar1 < 0) {
          return iVar1;
        }
      }
    }
    if ((*(long *)(local_20 + 0x50) == 0) || ((int)in_RSI[3] <= iVar2 + 1)) {
      for (; local_20 != *(long *)(local_20 + 0x20); local_20 = *(long *)(local_20 + 0x20)) {
        if (*(long *)(local_20 + 0x78) != 0) {
          local_20 = *(long *)(local_20 + 0x78);
          break;
        }
        iVar2 = iVar2 + -1;
      }
    }
    else {
      local_20 = *(long *)(local_20 + 0x50);
      iVar2 = iVar2 + 1;
    }
    if (local_20 == *(long *)(local_20 + 0x20)) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
_write_directory_descriptors(struct archive_write *a, struct vdd *vdd,
    struct isoent *isoent, int depth)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent **enttbl;
	unsigned char *p, *wb;
	int i, r;
	int dr_l;

	p = wb = wb_buffptr(a);
#define WD_REMAINING	(LOGICAL_BLOCK_SIZE - (p - wb))
	p += set_directory_record(p, WD_REMAINING, isoent,
	    iso9660, DIR_REC_SELF, vdd->vdd_type);
	p += set_directory_record(p, WD_REMAINING, isoent,
	    iso9660, DIR_REC_PARENT, vdd->vdd_type);

	if (isoent->children.cnt <= 0 || (vdd->vdd_type != VDD_JOLIET &&
	    !iso9660->opt.rr && depth + 1 >= vdd->max_depth)) {
		memset(p, 0, WD_REMAINING);
		return (wb_consume(a, LOGICAL_BLOCK_SIZE));
	}

	enttbl = isoent->children_sorted;
	for (i = 0; i < isoent->children.cnt; i++) {
		struct isoent *np = enttbl[i];
		struct isofile *file = np->file;

		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		file->cur_content = &(file->content);
		do {
			dr_l = set_directory_record(p, WD_REMAINING,
			    np, iso9660, DIR_REC_NORMAL,
			    vdd->vdd_type);
			if (dr_l == 0) {
				memset(p, 0, WD_REMAINING);
				r = wb_consume(a, LOGICAL_BLOCK_SIZE);
				if (r < 0)
					return (r);
				p = wb = wb_buffptr(a);
				dr_l = set_directory_record(p,
				    WD_REMAINING, np, iso9660,
				    DIR_REC_NORMAL, vdd->vdd_type);
			}
			p += dr_l;
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}
	memset(p, 0, WD_REMAINING);
	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}